

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall
GameBoard::checkDirectDropTo(GameBoard *this,int color,int blockType,int x,int y,int o)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  for (; x < 0x15; x = x + 1) {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      uVar2 = blockShape[blockType][o][lVar1 * 2] + x;
      if (((int)uVar2 < 0x15) &&
         ((((int)uVar2 < 1 ||
           (uVar3 = *(int *)((long)o * 0x20 + (long)blockType * 0x80 + 0x119ed4 + lVar1 * 8) + y,
           uVar3 - 0xb < 0xfffffff6)) || (this->gridInfo[color][uVar2][uVar3] != 0))))
      goto LAB_0011761d;
    }
  }
LAB_0011761d:
  return 0x14 < x;
}

Assistant:

bool GameBoard::checkDirectDropTo(int color, int blockType, int x, int y, int o)
{
    auto &def = blockShape[blockType][o];
    for (; x <= MAPHEIGHT; x++)
        for (int i = 0; i < 4; i++) {
            int _x = def[i * 2] + x, _y = def[i * 2 + 1] + y;
            if (_x > MAPHEIGHT)
                continue;
            if (_x < 1 || _y < 1 || _y > MAPWIDTH || gridInfo[color][_x][_y])
                return false;
        }
    return true;
}